

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPlugin.cpp
# Opt level: O0

TestPlugin * __thiscall TestPlugin::removePluginByName(TestPlugin *this,SimpleString *name)

{
  bool bVar1;
  SimpleString *left;
  TestPlugin *local_20;
  TestPlugin *removed;
  SimpleString *name_local;
  TestPlugin *this_local;
  
  local_20 = (TestPlugin *)0x0;
  if (this->next_ != (TestPlugin *)0x0) {
    left = getName(this->next_);
    bVar1 = operator==(left,name);
    if (bVar1) {
      local_20 = this->next_;
      this->next_ = this->next_->next_;
    }
  }
  return local_20;
}

Assistant:

TestPlugin* TestPlugin::removePluginByName(const SimpleString& name)
{
    TestPlugin* removed = NULLPTR;
    if (next_ && next_->getName() == name) {
        removed = next_;
        next_ = next_->next_;
    }
    return removed;
}